

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

void DPSprite::NewTick(void)

{
  long lVar1;
  int i;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  
  lVar2 = 0;
  do {
    if (playeringame[lVar2] == true) {
      lVar1 = (&DAT_00a60370)[lVar2 * 0x54];
      if (lVar1 != 0) {
        if ((*(byte *)(lVar1 + 0x20) & 0x20) == 0) {
          do {
            lVar4 = lVar1;
            *(undefined1 *)(lVar4 + 0x84) = 1;
            *(undefined8 *)(lVar4 + 0x38) = *(undefined8 *)(lVar4 + 0x28);
            *(undefined8 *)(lVar4 + 0x40) = *(undefined8 *)(lVar4 + 0x30);
            lVar1 = *(long *)(lVar4 + 0x60);
            if (lVar1 == 0) goto LAB_00557c34;
          } while ((*(byte *)(lVar1 + 0x20) & 0x20) == 0);
          puVar3 = (undefined8 *)(lVar4 + 0x60);
        }
        else {
          puVar3 = &DAT_00a60370 + lVar2 * 0x54;
        }
        *puVar3 = 0;
      }
    }
LAB_00557c34:
    lVar2 = lVar2 + 1;
    if (lVar2 == 8) {
      return;
    }
  } while( true );
}

Assistant:

void DPSprite::NewTick()
{
	// This function should be called after the beginning of a tick, before any possible
	// prprite-event, or near the end, after any possible psprite event.
	// Because data is reset for every tick (which it must be) this has no impact on savegames.
	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
		{
			DPSprite *pspr = players[i].psprites;
			while (pspr)
			{
				pspr->processPending = true;
				pspr->oldx = pspr->x;
				pspr->oldy = pspr->y;

				pspr = pspr->Next;
			}
		}
	}
}